

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O0

void __thiscall
llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::clear
          (StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *this)

{
  uint uVar1;
  StringMapEntryBase *pSVar2;
  bool bVar3;
  StringMapEntryBase **ppSVar4;
  StringMapEntryBase *pSVar5;
  StringMapEntryBase **Bucket;
  uint E;
  uint I;
  StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *this_local;
  
  bVar3 = StringMapImpl::empty(&this->super_StringMapImpl);
  if (!bVar3) {
    Bucket._4_4_ = 0;
    uVar1 = (this->super_StringMapImpl).NumBuckets;
    for (; Bucket._4_4_ != uVar1; Bucket._4_4_ = Bucket._4_4_ + 1) {
      ppSVar4 = (this->super_StringMapImpl).TheTable + Bucket._4_4_;
      if ((*ppSVar4 != (StringMapEntryBase *)0x0) &&
         (pSVar2 = *ppSVar4, pSVar5 = StringMapImpl::getTombstoneVal(), pSVar2 != pSVar5)) {
        StringMapEntry<llvm::cl::Option_*>::Destroy<llvm::MallocAllocator>
                  ((StringMapEntry<llvm::cl::Option_*> *)*ppSVar4,
                   (MallocAllocator *)&this->field_0x18);
      }
      *ppSVar4 = (StringMapEntryBase *)0x0;
    }
    (this->super_StringMapImpl).NumItems = 0;
    (this->super_StringMapImpl).NumTombstones = 0;
  }
  return;
}

Assistant:

void clear() {
    if (empty()) return;

    // Zap all values, resetting the keys back to non-present (not tombstone),
    // which is safe because we're removing all elements.
    for (unsigned I = 0, E = NumBuckets; I != E; ++I) {
      StringMapEntryBase *&Bucket = TheTable[I];
      if (Bucket && Bucket != getTombstoneVal()) {
        static_cast<MapEntryTy*>(Bucket)->Destroy(Allocator);
      }
      Bucket = nullptr;
    }

    NumItems = 0;
    NumTombstones = 0;
  }